

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O1

HighsStatus __thiscall
HighsIis::getData(HighsIis *this,HighsLp *lp,HighsOptions *options,HighsBasis *basis,
                 vector<int,_std::allocator<int>_> *infeasible_row)

{
  int iVar1;
  pointer piVar2;
  pointer pbVar3;
  pointer pbVar4;
  HighsIis *pHVar5;
  int iVar6;
  HighsStatus HVar7;
  long lVar8;
  double *pdVar9;
  HighsStatus HVar10;
  ulong uVar11;
  bool bVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  vector<int,_std::allocator<int>_> from_col;
  vector<int,_std::allocator<int>_> from_row;
  vector<int,_std::allocator<int>_> to_row;
  HighsLp to_lp;
  void *local_448;
  iterator iStack_440;
  int *local_438;
  ulong local_430;
  double local_428;
  vector<int,_std::allocator<int>_> local_420;
  vector<int,_std::allocator<int>_> local_408;
  HighsOptions *local_3e8;
  HighsIis *local_3e0;
  pointer local_3d8;
  pointer local_3d0;
  undefined1 local_3c8 [40];
  iterator local_3a0;
  double *local_398;
  vector<double,std::allocator<double>> local_390 [8];
  iterator local_388;
  double *local_380;
  vector<double,std::allocator<double>> local_378 [8];
  iterator local_370;
  double *local_368;
  vector<double,std::allocator<double>> local_360 [8];
  iterator local_358;
  double *local_350;
  uint local_344;
  HighsInt local_340;
  vector<int,_std::allocator<int>_> local_338 [2];
  pointer local_308;
  iterator local_300;
  int *local_2f8;
  vector<double,std::allocator<double>> local_2f0 [8];
  iterator local_2e8;
  double *local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268 [23];
  
  std::vector<int,_std::allocator<int>_>::vector(&local_420,infeasible_row);
  local_438 = (int *)0x0;
  local_448 = (void *)0x0;
  iStack_440._M_current = (int *)0x0;
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_3c8._0_4_ = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&local_408,(long)lp->num_row_,(value_type_conflict2 *)local_3c8);
  piVar2 = (infeasible_row->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = (uint)((ulong)((long)(infeasible_row->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
  if (0 < (int)uVar14) {
    uVar11 = 0;
    do {
      local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar2[uVar11]] = (int)uVar11;
      uVar11 = uVar11 + 1;
    } while ((uVar14 & 0x7fffffff) != uVar11);
  }
  local_3c8._0_4_ = 0;
  if (0 < lp->num_col_) {
    do {
      piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = piVar2[(int)local_3c8._0_4_];
      lVar8 = (long)iVar6;
      iVar1 = piVar2[(long)(int)local_3c8._0_4_ + 1];
      if (iVar6 < iVar1) {
        bVar12 = false;
        do {
          bVar16 = true;
          if (!bVar12) {
            bVar16 = -1 < local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [(lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar8]];
          }
          lVar8 = lVar8 + 1;
          bVar12 = bVar16;
        } while (iVar1 != lVar8);
        if (bVar16) {
          if (iStack_440._M_current == local_438) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_448,iStack_440,(int *)local_3c8);
          }
          else {
            *iStack_440._M_current = local_3c8._0_4_;
            iStack_440._M_current = iStack_440._M_current + 1;
          }
        }
      }
      local_3c8._0_4_ = local_3c8._0_4_ + 1;
    } while ((int)local_3c8._0_4_ < lp->num_col_);
  }
  uVar15 = (long)iStack_440._M_current - (long)local_448;
  uVar11 = (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_3e8 = options;
  local_3e0 = this;
  HighsLp::HighsLp((HighsLp *)local_3c8);
  local_430 = uVar11 >> 2;
  local_3c8._0_4_ = (undefined4)(uVar15 >> 2);
  local_3c8._4_4_ = (undefined4)local_430;
  local_344 = local_3c8._0_4_;
  local_340 = local_3c8._4_4_;
  if (0 < (int)local_3c8._0_4_) {
    local_3d0 = (lp->col_names_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_3d8 = (lp->col_names_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    uVar14 = local_3c8._0_4_ & 0x7fffffff;
    uVar11 = 0;
    do {
      local_428 = 0.0;
      if (local_3c8._16_8_ == local_3c8._24_8_) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  ((vector<double,_std::allocator<double>_> *)(local_3c8 + 8),
                   (iterator)local_3c8._16_8_,&local_428);
      }
      else {
        *(double *)local_3c8._16_8_ = 0.0;
        local_3c8._16_8_ = local_3c8._16_8_ + 8;
      }
      pdVar9 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + *(int *)((long)local_448 + uVar11 * 4);
      if (local_3a0._M_current == local_398) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)(local_3c8 + 0x20),local_3a0,pdVar9);
      }
      else {
        *local_3a0._M_current = *pdVar9;
        local_3a0._M_current = local_3a0._M_current + 1;
      }
      pdVar9 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + *(int *)((long)local_448 + uVar11 * 4);
      if (local_388._M_current == local_380) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_390,local_388,pdVar9);
      }
      else {
        *local_388._M_current = *pdVar9;
        local_388._M_current = local_388._M_current + 1;
      }
      if (local_3d8 != local_3d0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_280,
                    (lp->col_names_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    *(int *)((long)local_448 + uVar11 * 4));
      }
      lVar8 = (long)*(int *)((long)local_448 + uVar11 * 4);
      piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = piVar2[lVar8];
      lVar13 = (long)iVar6;
      if (iVar6 < piVar2[lVar8 + 1]) {
        lVar8 = lVar13 * 8;
        do {
          iVar6 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13];
          if (-1 < local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar6]) {
            if (local_300._M_current == local_2f8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_308,local_300,
                         local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + iVar6);
            }
            else {
              *local_300._M_current =
                   local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar6];
              local_300._M_current = local_300._M_current + 1;
            }
            pdVar9 = (double *)
                     ((long)(lp->a_matrix_).value_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar8);
            if (local_2e8._M_current == local_2e0) {
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        (local_2f0,local_2e8,pdVar9);
            }
            else {
              *local_2e8._M_current = *pdVar9;
              local_2e8._M_current = local_2e8._M_current + 1;
            }
          }
          lVar13 = lVar13 + 1;
          lVar8 = lVar8 + 8;
        } while (lVar13 < (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start
                          [(long)*(int *)((long)local_448 + uVar11 * 4) + 1]);
      }
      iVar6 = (int)((ulong)((long)local_300._M_current - (long)local_308) >> 2);
      local_428 = (double)CONCAT44(local_428._4_4_,iVar6);
      if (local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_338,
                   (iterator)
                   local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_428);
      }
      else {
        *local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar6;
        local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_338[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar14);
  }
  if (0 < (int)(uint)local_430) {
    pbVar3 = (lp->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (lp->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_430 = (ulong)((uint)local_430 & 0x7fffffff);
    uVar11 = 0;
    do {
      pdVar9 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start +
               local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11];
      if (local_370._M_current == local_368) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_378,local_370,pdVar9);
      }
      else {
        *local_370._M_current = *pdVar9;
        local_370._M_current = local_370._M_current + 1;
      }
      pdVar9 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start +
               local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11];
      if (local_358._M_current == local_350) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_360,local_358,pdVar9);
      }
      else {
        *local_358._M_current = *pdVar9;
        local_358._M_current = local_358._M_current + 1;
      }
      if (pbVar4 != pbVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_268,
                    (lp->row_names_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11]);
      }
      uVar11 = uVar11 + 1;
    } while (local_430 != uVar11);
  }
  pHVar5 = local_3e0;
  HVar7 = compute(local_3e0,(HighsLp *)local_3c8,local_3e8,(HighsBasis *)0x0);
  HVar10 = kError;
  if (HVar7 == kOk) {
    piVar2 = (pHVar5->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = (uint)((ulong)((long)(pHVar5->col_index_).super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
    if (0 < (int)uVar14) {
      uVar11 = 0;
      do {
        piVar2[uVar11] = *(int *)((long)local_448 + (long)piVar2[uVar11] * 4);
        uVar11 = uVar11 + 1;
      } while ((uVar14 & 0x7fffffff) != uVar11);
    }
    piVar2 = (pHVar5->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = (uint)((ulong)((long)(pHVar5->row_index_).super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
    if ((int)uVar14 < 1) {
      HVar10 = kOk;
    }
    else {
      HVar10 = kOk;
      uVar11 = 0;
      do {
        piVar2[uVar11] =
             local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[piVar2[uVar11]];
        uVar11 = uVar11 + 1;
      } while ((uVar14 & 0x7fffffff) != uVar11);
    }
  }
  HighsLp::~HighsLp((HighsLp *)local_3c8);
  if (local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_408.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_448 != (void *)0x0) {
    operator_delete(local_448);
  }
  if (local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar10;
}

Assistant:

HighsStatus HighsIis::getData(const HighsLp& lp, const HighsOptions& options,
                              const HighsBasis& basis,
                              const std::vector<HighsInt>& infeasible_row) {
  // Check for trivial IIS should have been done earlier
  assert(!this->trivial(lp, options));
  // The number of infeasible rows must be positive
  assert(infeasible_row.size() > 0);
  // Identify the LP corresponding to the set of infeasible rows
  std::vector<HighsInt> from_row = infeasible_row;
  std::vector<HighsInt> from_col;
  std::vector<HighsInt> to_row;
  to_row.assign(lp.num_row_, -1);
  assert(lp.a_matrix_.isColwise());
  // Determine how to detect whether a row is in infeasible_row and
  // (then) gather information about it
  for (HighsInt iX = 0; iX < HighsInt(infeasible_row.size()); iX++)
    to_row[infeasible_row[iX]] = iX;
  // Identify the columns (from_col) with nonzeros in the infeasible
  // rows
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    bool use_col = false;
    for (HighsInt iEl = lp.a_matrix_.start_[iCol];
         iEl < lp.a_matrix_.start_[iCol + 1]; iEl++)
      use_col = use_col || to_row[lp.a_matrix_.index_[iEl]] >= 0;
    if (use_col) from_col.push_back(iCol);
  }
  HighsInt to_num_col = from_col.size();
  HighsInt to_num_row = from_row.size();
  HighsLp to_lp;
  to_lp.num_col_ = to_num_col;
  to_lp.num_row_ = to_num_row;
  to_lp.a_matrix_.num_col_ = to_lp.num_col_;
  to_lp.a_matrix_.num_row_ = to_lp.num_row_;
  const bool has_col_names = lp.col_names_.size() > 0;
  for (HighsInt iCol = 0; iCol < to_num_col; iCol++) {
    to_lp.col_cost_.push_back(0);
    to_lp.col_lower_.push_back(lp.col_lower_[from_col[iCol]]);
    to_lp.col_upper_.push_back(lp.col_upper_[from_col[iCol]]);
    if (has_col_names)
      to_lp.col_names_.push_back(lp.col_names_[from_col[iCol]]);
    for (HighsInt iEl = lp.a_matrix_.start_[from_col[iCol]];
         iEl < lp.a_matrix_.start_[from_col[iCol] + 1]; iEl++) {
      HighsInt iRow = lp.a_matrix_.index_[iEl];
      if (to_row[iRow] >= 0) {
        to_lp.a_matrix_.index_.push_back(to_row[iRow]);
        to_lp.a_matrix_.value_.push_back(lp.a_matrix_.value_[iEl]);
      }
    }
    to_lp.a_matrix_.start_.push_back(to_lp.a_matrix_.index_.size());
  }
  const bool has_row_names = lp.row_names_.size() > 0;
  for (HighsInt iRow = 0; iRow < to_num_row; iRow++) {
    to_lp.row_lower_.push_back(lp.row_lower_[from_row[iRow]]);
    to_lp.row_upper_.push_back(lp.row_upper_[from_row[iRow]]);
    if (has_row_names)
      to_lp.row_names_.push_back(lp.row_names_[from_row[iRow]]);
  }
  if (this->compute(to_lp, options) != HighsStatus::kOk)
    return HighsStatus::kError;
  // Indirect the values into the original LP
  for (HighsInt iCol = 0; iCol < HighsInt(this->col_index_.size()); iCol++)
    this->col_index_[iCol] = from_col[this->col_index_[iCol]];
  for (HighsInt iRow = 0; iRow < HighsInt(this->row_index_.size()); iRow++)
    this->row_index_[iRow] = from_row[this->row_index_[iRow]];
  if (kIisDevReport) this->report("On exit", lp);
  return HighsStatus::kOk;
}